

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O1

unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
__thiscall duckdb::StreamQueryResult::LockContext(StreamQueryResult *this)

{
  InvalidInputException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_RSI;
  string error_str;
  string local_a0;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  string local_60;
  string local_40;
  
  if (*(long *)(in_RSI + 0x188) != 0) {
    shared_ptr<duckdb::ClientContext,_true>::operator->
              ((shared_ptr<duckdb::ClientContext,_true> *)(in_RSI + 0x188));
    ClientContext::LockContext((ClientContext *)this);
    return (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
           (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
           this;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Attempting to execute an unsuccessful or closed pending query result","");
  if (*(char *)(in_RSI + 200) == '\0') {
    local_80[0] = local_70;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"\nError: %s","");
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,*(long *)(in_RSI + 0xf8),
               *(long *)(in_RSI + 0x100) + *(long *)(in_RSI + 0xf8));
    StringUtil::Format<std::__cxx11::string>(&local_60,(StringUtil *)local_80,&local_a0,in_RCX);
    ::std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0]);
    }
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this_00,&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ClientContextLock> StreamQueryResult::LockContext() {
	if (!context) {
		string error_str = "Attempting to execute an unsuccessful or closed pending query result";
		if (HasError()) {
			error_str += StringUtil::Format("\nError: %s", GetError());
		}
		throw InvalidInputException(error_str);
	}
	return context->LockContext();
}